

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O3

void __thiscall FastPForLib::ZRandom::seed(ZRandom *this,uint iSeed)

{
  bool bVar1;
  ulong uVar2;
  int i;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM5 [64];
  undefined1 auVar9 [64];
  
  _i = 1;
  this->nValues = 0;
  this->MT[0] = iSeed;
  do {
    iSeed = iSeed * 0x10dcd + 1;
    this->MT[_i] = iSeed;
    _i = _i + 1;
  } while (_i != 0x270);
  auVar3 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar4 = vpbroadcastq_avx512f(ZEXT816(0xe3));
  auVar5 = vpbroadcastq_avx512f(ZEXT816(0xffffff1d));
  auVar6 = vpbroadcastq_avx512f(ZEXT816(8));
  _i = 0x139;
  auVar7 = vpbroadcastq_avx512f();
  do {
    uVar2 = vpcmpuq_avx512f(auVar3,auVar4,1);
    auVar8._8_8_ = 0x18d;
    auVar8._0_8_ = 0x18d;
    auVar8._16_8_ = 0x18d;
    auVar8._24_8_ = 0x18d;
    auVar8._32_8_ = 0x18d;
    auVar8._40_8_ = 0x18d;
    auVar8._48_8_ = 0x18d;
    auVar8._56_8_ = 0x18d;
    auVar8 = vpblendmq_avx512f(auVar5,auVar8);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar9._0_8_ = (ulong)bVar1 * auVar8._0_8_ | (ulong)!bVar1 * in_ZMM5._0_8_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar9._8_8_ = (ulong)bVar1 * auVar8._8_8_ | (ulong)!bVar1 * in_ZMM5._8_8_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar9._16_8_ = (ulong)bVar1 * auVar8._16_8_ | (ulong)!bVar1 * in_ZMM5._16_8_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar9._24_8_ = (ulong)bVar1 * auVar8._24_8_ | (ulong)!bVar1 * in_ZMM5._24_8_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar9._32_8_ = (ulong)bVar1 * auVar8._32_8_ | (ulong)!bVar1 * in_ZMM5._32_8_;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar9._40_8_ = (ulong)bVar1 * auVar8._40_8_ | (ulong)!bVar1 * in_ZMM5._40_8_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar9._48_8_ = (ulong)bVar1 * auVar8._48_8_ | (ulong)!bVar1 * in_ZMM5._48_8_;
    auVar9._56_8_ = (uVar2 >> 7) * auVar8._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * in_ZMM5._56_8_;
    auVar8 = vpaddq_avx512f(auVar9,auVar3);
    auVar3 = vpaddq_avx512f(auVar3,auVar6);
    auVar8 = vmovdqa32_avx512f(auVar8);
    auVar10._0_4_ = auVar8._0_4_;
    auVar10._4_4_ = 0;
    auVar10._8_4_ = auVar8._8_4_;
    auVar10._12_4_ = 0;
    auVar10._16_4_ = auVar8._16_4_;
    auVar10._20_4_ = 0;
    auVar10._24_4_ = auVar8._24_4_;
    auVar10._28_4_ = 0;
    auVar10._32_4_ = auVar8._32_4_;
    auVar10._36_4_ = 0;
    auVar10._40_4_ = auVar8._40_4_;
    auVar10._44_4_ = 0;
    auVar10._48_4_ = auVar8._48_4_;
    auVar10._52_4_ = 0;
    auVar10._56_4_ = auVar8._56_4_;
    auVar10._60_4_ = 0;
    auVar8 = vpsllq_avx512f(auVar10,2);
    in_ZMM5 = vpaddq_avx512f(auVar7,auVar8);
    auVar8 = vmovdqu64_avx512f(in_ZMM5);
    *(undefined1 (*) [64])(this->MT + _i * 2) = auVar8;
    _i = _i + 8;
  } while (_i != 0x3a9);
  return;
}

Assistant:

void ZRandom::seed(unsigned iSeed) {
  nValues = 0;
  // Seed the array used in random number generation.
  MT[0] = iSeed;
  for (int i = 1; i < N; ++i) {
    MT[i] = 1 + (69069 * MT[i - 1]);
  }
  // Compute map once to avoid % in inner loop.
  for (int i = 0; i < N; ++i) {
    map[i] = MT + ((i + M) % N);
  }
}